

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputedValues.h
# Opt level: O0

TransformPtr __thiscall Rml::Style::ComputedValues::transform(ComputedValues *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  PropertyId in_SIL;
  TransformPtr TVar1;
  shared_ptr<Rml::Transform> local_28;
  ComputedValues *this_local;
  
  this_local = this;
  ::std::shared_ptr<Rml::Transform>::shared_ptr(&local_28);
  GetLocalProperty<std::shared_ptr<Rml::Transform>>(this,in_SIL,(shared_ptr<Rml::Transform> *)0x43);
  ::std::shared_ptr<Rml::Transform>::~shared_ptr(&local_28);
  TVar1.super___shared_ptr<Rml::Transform,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  TVar1.super___shared_ptr<Rml::Transform,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (TransformPtr)TVar1.super___shared_ptr<Rml::Transform,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TransformPtr      transform()                  const { return GetLocalProperty(PropertyId::Transform, TransformPtr()); }